

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O2

bool correctGraphicsWidgetContext(ShortcutContext context,QGraphicsWidget *w,QWidget *active_window)

{
  bool bVar1;
  WindowType WVar2;
  QGraphicsScene *pQVar3;
  QGraphicsScene *pQVar4;
  QGraphicsItem *pQVar5;
  QGraphicsItem *pQVar6;
  QWidget *pQVar7;
  QGraphicsWidget *pQVar8;
  QGraphicsWidget *pQVar9;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  QArrayDataPointer<QGraphicsView_*> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (active_window != (QWidget *)0x0) {
    pQVar5 = &(w->super_QGraphicsObject).super_QGraphicsItem;
    bVar1 = QGraphicsItem::isVisible(pQVar5);
    if (((bVar1) && (bVar1 = QGraphicsItem::isEnabled(pQVar5), bVar1)) &&
       (pQVar3 = QGraphicsItem::scene(pQVar5), pQVar3 != (QGraphicsScene *)0x0)) {
      if (context == WidgetShortcut) {
        pQVar4 = (QGraphicsScene *)QGraphicsItem::scene(pQVar5);
        pQVar6 = QGraphicsScene::focusItem(pQVar4);
        bVar1 = pQVar5 == pQVar6;
        goto LAB_0037f50b;
      }
      if (context != WidgetWithChildrenShortcut) {
        if (context == ApplicationShortcut) {
          pQVar4 = (QGraphicsScene *)QGraphicsItem::scene(pQVar5);
          QGraphicsScene::views((QList<QGraphicsView_*> *)&local_50,pQVar4);
          lVar10 = 0;
          do {
            bVar11 = local_50.size << 3 == lVar10;
            bVar1 = !bVar11;
            if (bVar11) break;
            bVar11 = QApplicationPrivate::tryModalHelper
                               (*(QWidget **)((long)local_50.ptr + lVar10),(QWidget **)0x0);
            lVar10 = lVar10 + 8;
          } while (!bVar11);
        }
        else {
          pQVar4 = (QGraphicsScene *)QGraphicsItem::scene(pQVar5);
          QGraphicsScene::views((QList<QGraphicsView_*> *)&local_50,pQVar4);
          lVar10 = 0;
          do {
            if (local_50.size << 3 == lVar10) {
              bVar1 = false;
              goto LAB_0037f5bc;
            }
            pQVar7 = QWidget::window(*(QWidget **)((long)local_50.ptr + lVar10));
            lVar10 = lVar10 + 8;
          } while (pQVar7 != active_window);
          pQVar4 = (QGraphicsScene *)QGraphicsItem::scene(pQVar5);
          pQVar8 = QGraphicsScene::activeWindow(pQVar4);
          pQVar9 = QGraphicsItem::window(pQVar5);
          if (pQVar9 == (QGraphicsWidget *)0x0) {
            bVar1 = true;
          }
          else {
            pQVar9 = QGraphicsItem::window(pQVar5);
            bVar1 = pQVar8 == pQVar9;
          }
        }
LAB_0037f5bc:
        QArrayDataPointer<QGraphicsView_*>::~QArrayDataPointer(&local_50);
        goto LAB_0037f50b;
      }
      pQVar4 = (QGraphicsScene *)QGraphicsItem::scene(pQVar5);
      pQVar5 = QGraphicsScene::focusItem(pQVar4);
      if ((pQVar5 != (QGraphicsItem *)0x0) && (bVar1 = QGraphicsItem::isWidget(pQVar5), bVar1)) {
        for (pQVar8 = (QGraphicsWidget *)(pQVar5 + -1);
            (bVar1 = pQVar8 == w, pQVar8 != (QGraphicsWidget *)0x0 && (pQVar8 != w));
            pQVar8 = QGraphicsItem::parentWidget
                               (&(pQVar8->super_QGraphicsObject).super_QGraphicsItem)) {
          WVar2 = QGraphicsWidget::windowType((QGraphicsWidget *)pQVar8);
          if ((WVar2 != Widget) &&
             (WVar2 = QGraphicsWidget::windowType((QGraphicsWidget *)pQVar8), WVar2 != Popup))
          goto LAB_0037f509;
        }
        goto LAB_0037f50b;
      }
    }
  }
LAB_0037f509:
  bVar1 = false;
LAB_0037f50b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

static bool correctGraphicsWidgetContext(Qt::ShortcutContext context, QGraphicsWidget *w, QWidget *active_window)
{
    if (!active_window)
        return false;

    bool visible = w->isVisible();
#if defined(Q_OS_DARWIN) && QT_CONFIG(menubar)
    if (!QCoreApplication::testAttribute(Qt::AA_DontUseNativeMenuBar) && qobject_cast<QMenuBar *>(w))
        visible = true;
#endif

    if (!visible || !w->isEnabled() || !w->scene())
        return false;

    if (context == Qt::ApplicationShortcut) {
        // Applicationwide shortcuts are always reachable unless their owner
        // is shadowed by modality. In QGV there's no modality concept, but we
        // must still check if all views are shadowed.
        const auto &views = w->scene()->views();
        for (auto view : views) {
            if (QApplicationPrivate::tryModalHelper(view, nullptr))
                return true;
        }
        return false;
    }

    if (context == Qt::WidgetShortcut)
        return static_cast<QGraphicsItem *>(w) == w->scene()->focusItem();

    if (context == Qt::WidgetWithChildrenShortcut) {
        const QGraphicsItem *ti = w->scene()->focusItem();
        if (ti && ti->isWidget()) {
            const auto *tw = static_cast<const QGraphicsWidget *>(ti);
            while (tw && tw != w && (tw->windowType() == Qt::Widget || tw->windowType() == Qt::Popup))
                tw = tw->parentWidget();
            return tw == w;
        }
        return false;
    }

    // Below is Qt::WindowShortcut context

    // Find the active view (if any).
    const auto &views = w->scene()->views();
    QGraphicsView *activeView = nullptr;
    for (auto view : views) {
        if (view->window() == active_window) {
            activeView = view;
            break;
        }
    }
    if (!activeView)
        return false;

    // The shortcut is reachable if owned by a windowless widget, or if the
    // widget's window is the same as the focus item's window.
    QGraphicsWidget *a = w->scene()->activeWindow();
    return !w->window() || a == w->window();
}